

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O3

int njoy::tools::disco::Integer<2u>::
    read<int,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *param_2)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  runtime_error *this;
  int iVar4;
  uint uVar5;
  char *first;
  bool bVar6;
  bool bVar7;
  from_chars_result_t<char> fVar8;
  int value;
  int local_2c;
  
  pcVar3 = iter->_M_current;
  local_2c = 0;
  bVar6 = false;
  bVar7 = false;
  iVar4 = 0;
  if (*pcVar3 == ' ') {
    iter->_M_current = pcVar3 + 1;
    cVar1 = pcVar3[1];
    iVar4 = 1;
    bVar6 = cVar1 == ' ';
    if (bVar6) {
      iter->_M_current = pcVar3 + 2;
      iVar4 = 2;
    }
    bVar7 = cVar1 != ' ';
  }
  bVar2 = isNewLine<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(iter);
  if (!bVar2) {
    first = iter->_M_current;
    if (bVar6 || *first == -1) {
      return local_2c;
    }
    if (*first == '+') {
      first = first + 1;
      iter->_M_current = first;
      iVar4 = 1;
      if (bVar7) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"cannot parse invalid integer number 1");
        goto LAB_00134702;
      }
    }
    fVar8 = fast_float::from_chars<int,char,int>(first,pcVar3 + 2,&local_2c,10);
    if (fVar8.ec != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"cannot parse invalid integer number 2");
LAB_00134702:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = iVar4 + ((int)fVar8.ptr - (int)iter->_M_current);
    iter->_M_current = fVar8.ptr;
    if (uVar5 < 2) {
      pcVar3 = fVar8.ptr;
      bVar6 = uVar5 == 0;
      do {
        bVar7 = bVar6;
        if (*pcVar3 != ' ') goto LAB_00134685;
        iter->_M_current = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
        bVar6 = false;
      } while (bVar7);
    }
    else if (uVar5 != 2) {
LAB_00134685:
      bVar6 = isNewLine<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(iter);
      if ((!bVar6) && (*iter->_M_current != -1)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"cannot parse invalid integer number 3");
        goto LAB_00134702;
      }
    }
  }
  return local_2c;
}

Assistant:

static Representation read( Iterator& iter, const Iterator& ) {

    unsigned int position = 0;
    const auto end = iter + Width;
    Representation value = 0;

    skipSpaces( iter, position );
    if ( isNewLine( iter ) || isEndOfFile( iter ) || Width == position ) {

      return value;
    }

    skipPlusSign( iter, position );
    if ( Width == position ) {

      throw std::runtime_error( "cannot parse invalid integer number 1" );
    }

    // we are using fast_float::from_chars instead of std::from_chars since
    // not all standard c++ libraries implement the floating point version of
    // std::from_chars
    auto result = fast_float::from_chars( &*iter, &*end, value );
    if ( result.ec == std::errc() ) {

      auto advance = result.ptr - &*iter;
      iter += advance;
      position += advance;
    }
    else {

      throw std::runtime_error( "cannot parse invalid integer number 2" );
    }

    skipSpaces( iter, position );
    if ( Width != position ) {

      if ( ! isNewLine( iter ) && ! isEndOfFile( iter ) ) {

        throw std::runtime_error( "cannot parse invalid integer number 3" );
      }
    }

    return value;
  }